

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::BrokenClient::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          BrokenClient *this)

{
  Own<kj::_::PromiseNode> local_178;
  Exception local_168;
  
  if (this->resolved == true) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    kj::Exception::Exception(&local_168,&this->exception);
    kj::Promise<kj::Own<capnp::ClientHook>_>::Promise
              ((Promise<kj::Own<capnp::ClientHook>_> *)&local_178,&local_168);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer = local_178.disposer
    ;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = local_178.ptr;
    local_178.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_178);
    kj::Exception::~Exception(&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return nullptr;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }